

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregates.cpp
# Opt level: O2

BVHBuildNode * __thiscall
pbrt::BVHAggregate::buildHLBVH
          (BVHAggregate *this,Allocator alloc,
          vector<pbrt::BVHPrimitive,_std::allocator<pbrt::BVHPrimitive>_> *bvhPrimitives,
          atomic<int> *totalNodes,
          vector<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_> *orderedPrims)

{
  int *piVar1;
  pointer pBVar2;
  MortonPrimitive *pMVar3;
  pointer pMVar4;
  pointer pMVar5;
  pointer pMVar6;
  BVHAggregate *this_00;
  pointer pLVar7;
  int pass;
  uint uVar8;
  int iVar9;
  undefined4 extraout_var;
  BVHBuildNode *pBVar10;
  pointer pBVar11;
  vector<pbrt::BVHPrimitive,_std::allocator<pbrt::BVHPrimitive>_> *__range1;
  MortonPrimitive *pMVar12;
  pointer *ppMVar13;
  int iVar14;
  MortonPrimitive *pMVar15;
  _Vector_base<pbrt::MortonPrimitive,_std::allocator<pbrt::MortonPrimitive>_> *p_Var16;
  int i;
  long lVar17;
  ulong uVar18;
  int iVar19;
  pointer pLVar20;
  undefined1 auVar21 [16];
  _Vector_base<pbrt::MortonPrimitive,_std::allocator<pbrt::MortonPrimitive>_> local_2f8;
  Allocator local_2e0;
  atomic<int> *totalNodes_local;
  vector<pbrt::BVHPrimitive,_std::allocator<pbrt::BVHPrimitive>_> *local_2d0;
  vector<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_> *local_2c8;
  BVHAggregate *local_2c0;
  atomic<int> orderedPrimsOffset;
  pointer pMStack_2b0;
  pointer local_2a8;
  _Any_data local_298;
  code *pcStack_288;
  code *pcStack_280;
  _Any_data local_278;
  code *pcStack_268;
  code *pcStack_260;
  pointer local_258;
  pointer pLStack_250;
  pointer local_248;
  int iStack_23c;
  vector<pbrt::LBVHTreelet,_std::allocator<pbrt::LBVHTreelet>_> treeletsToBuild;
  vector<pbrt::BVHBuildNode_*,_std::allocator<pbrt::BVHBuildNode_*>_> finishedTreelets;
  
  auVar21._8_4_ = 0xff7fffff;
  auVar21._0_8_ = 0xff7fffffff7fffff;
  auVar21._12_4_ = 0xff7fffff;
  local_258 = (pointer)0x7f7fffff7f7fffff;
  pLStack_250 = (pointer)0xff7fffff7f7fffff;
  local_248 = (pointer)vmovlps_avx(auVar21);
  pBVar2 = (bvhPrimitives->
           super__Vector_base<pbrt::BVHPrimitive,_std::allocator<pbrt::BVHPrimitive>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  local_2e0.memoryResource = alloc.memoryResource;
  totalNodes_local = totalNodes;
  local_2c8 = orderedPrims;
  local_2c0 = this;
  for (pBVar11 = (bvhPrimitives->
                 super__Vector_base<pbrt::BVHPrimitive,_std::allocator<pbrt::BVHPrimitive>_>).
                 _M_impl.super__Vector_impl_data._M_start; pBVar11 != pBVar2; pBVar11 = pBVar11 + 1)
  {
    Union<float>((Bounds3<float> *)&treeletsToBuild,(Bounds3<float> *)&local_258,&pBVar11->centroid)
    ;
    local_258 = treeletsToBuild.
                super__Vector_base<pbrt::LBVHTreelet,_std::allocator<pbrt::LBVHTreelet>_>._M_impl.
                super__Vector_impl_data._M_start;
    pLStack_250 = treeletsToBuild.
                  super__Vector_base<pbrt::LBVHTreelet,_std::allocator<pbrt::LBVHTreelet>_>._M_impl.
                  super__Vector_impl_data._M_finish;
    local_248 = treeletsToBuild.
                super__Vector_base<pbrt::LBVHTreelet,_std::allocator<pbrt::LBVHTreelet>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage;
  }
  std::vector<pbrt::MortonPrimitive,_std::allocator<pbrt::MortonPrimitive>_>::vector
            ((vector<pbrt::MortonPrimitive,_std::allocator<pbrt::MortonPrimitive>_> *)&local_2f8,
             ((long)(bvhPrimitives->
                    super__Vector_base<pbrt::BVHPrimitive,_std::allocator<pbrt::BVHPrimitive>_>).
                    _M_impl.super__Vector_impl_data._M_finish -
             (long)(bvhPrimitives->
                   super__Vector_base<pbrt::BVHPrimitive,_std::allocator<pbrt::BVHPrimitive>_>).
                   _M_impl.super__Vector_impl_data._M_start) / 0x30,
             (allocator_type *)&treeletsToBuild);
  pBVar11 = (bvhPrimitives->
            super__Vector_base<pbrt::BVHPrimitive,_std::allocator<pbrt::BVHPrimitive>_>)._M_impl.
            super__Vector_impl_data._M_start;
  pBVar2 = (bvhPrimitives->
           super__Vector_base<pbrt::BVHPrimitive,_std::allocator<pbrt::BVHPrimitive>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  local_278._M_unused._M_object = (void *)0x0;
  local_278._8_8_ = 0;
  pcStack_268 = (code *)0x0;
  pcStack_260 = (code *)0x0;
  local_278._M_unused._M_object = operator_new(0x18);
  *(_Vector_base<pbrt::MortonPrimitive,_std::allocator<pbrt::MortonPrimitive>_> **)
   local_278._M_unused._0_8_ = &local_2f8;
  *(vector<pbrt::BVHPrimitive,_std::allocator<pbrt::BVHPrimitive>_> **)
   ((long)local_278._M_unused._0_8_ + 8) = bvhPrimitives;
  *(Bounds3<float> **)((long)local_278._M_unused._0_8_ + 0x10) = (Bounds3<float> *)&local_258;
  pcStack_260 = std::
                _Function_handler<void_(long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cpu/aggregates.cpp:405:42)>
                ::_M_invoke;
  pcStack_268 = std::
                _Function_handler<void_(long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cpu/aggregates.cpp:405:42)>
                ::_M_manager;
  local_2d0 = bvhPrimitives;
  ParallelFor(0,((long)pBVar2 - (long)pBVar11) / 0x30,(function<void_(long)> *)&local_278);
  std::_Function_base::~_Function_base((_Function_base *)&local_278);
  std::vector<pbrt::MortonPrimitive,_std::allocator<pbrt::MortonPrimitive>_>::vector
            ((vector<pbrt::MortonPrimitive,_std::allocator<pbrt::MortonPrimitive>_> *)
             &orderedPrimsOffset,
             (long)local_2f8._M_impl.super__Vector_impl_data._M_finish -
             (long)local_2f8._M_impl.super__Vector_impl_data._M_start >> 3,
             (allocator_type *)&treeletsToBuild);
  pMVar6 = local_2f8._M_impl.super__Vector_impl_data._M_end_of_storage;
  pMVar5 = local_2f8._M_impl.super__Vector_impl_data._M_finish;
  pMVar4 = local_2f8._M_impl.super__Vector_impl_data._M_start;
  for (uVar8 = 0; uVar8 != 5; uVar8 = uVar8 + 1) {
    treeletsToBuild.super__Vector_base<pbrt::LBVHTreelet,_std::allocator<pbrt::LBVHTreelet>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    treeletsToBuild.super__Vector_base<pbrt::LBVHTreelet,_std::allocator<pbrt::LBVHTreelet>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    treeletsToBuild.super__Vector_base<pbrt::LBVHTreelet,_std::allocator<pbrt::LBVHTreelet>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ppMVar13 = &pMStack_2b0;
    p_Var16 = (_Vector_base<pbrt::MortonPrimitive,_std::allocator<pbrt::MortonPrimitive>_> *)
              &orderedPrimsOffset;
    if ((uVar8 & 1) == 0) {
      ppMVar13 = &local_2f8._M_impl.super__Vector_impl_data._M_finish;
      p_Var16 = &local_2f8;
    }
    pMVar3 = *ppMVar13;
    pMVar12 = (((vector<pbrt::MortonPrimitive,_std::allocator<pbrt::MortonPrimitive>_> *)p_Var16)->
              super__Vector_base<pbrt::MortonPrimitive,_std::allocator<pbrt::MortonPrimitive>_>).
              _M_impl.super__Vector_impl_data._M_start;
    for (pMVar15 = pMVar12; pMVar15 != pMVar3; pMVar15 = pMVar15 + 1) {
      piVar1 = (int *)((long)&treeletsToBuild.
                              super__Vector_base<pbrt::LBVHTreelet,_std::allocator<pbrt::LBVHTreelet>_>
                              ._M_impl.super__Vector_impl_data._M_start +
                      (ulong)(pMVar15->mortonCode >> (uVar8 * 6 & 0x1f) & 0x3f) * 4);
      *piVar1 = *piVar1 + 1;
    }
    finishedTreelets.super__Vector_base<pbrt::BVHBuildNode_*,_std::allocator<pbrt::BVHBuildNode_*>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)((ulong)finishedTreelets.
                          super__Vector_base<pbrt::BVHBuildNode_*,_std::allocator<pbrt::BVHBuildNode_*>_>
                          ._M_impl.super__Vector_impl_data._M_start & 0xffffffff00000000);
    iVar14 = 0;
    for (lVar17 = 1; lVar17 != 0x40; lVar17 = lVar17 + 1) {
      iVar14 = iVar14 + (&iStack_23c)[lVar17];
      *(int *)((long)&finishedTreelets.
                      super__Vector_base<pbrt::BVHBuildNode_*,_std::allocator<pbrt::BVHBuildNode_*>_>
                      ._M_impl.super__Vector_impl_data._M_start + lVar17 * 4) = iVar14;
    }
    for (; pMVar12 != pMVar3; pMVar12 = pMVar12 + 1) {
      uVar18 = (ulong)(pMVar12->mortonCode >> (uVar8 * 6 & 0x1f) & 0x3f);
      iVar14 = *(int *)((long)&finishedTreelets.
                               super__Vector_base<pbrt::BVHBuildNode_*,_std::allocator<pbrt::BVHBuildNode_*>_>
                               ._M_impl.super__Vector_impl_data._M_start + uVar18 * 4);
      *(int *)((long)&finishedTreelets.
                      super__Vector_base<pbrt::BVHBuildNode_*,_std::allocator<pbrt::BVHBuildNode_*>_>
                      ._M_impl.super__Vector_impl_data._M_start + uVar18 * 4) = iVar14 + 1;
      p_Var16 = &local_2f8;
      if ((uVar8 & 1) == 0) {
        p_Var16 = (_Vector_base<pbrt::MortonPrimitive,_std::allocator<pbrt::MortonPrimitive>_> *)
                  &orderedPrimsOffset;
      }
      (((vector<pbrt::MortonPrimitive,_std::allocator<pbrt::MortonPrimitive>_> *)p_Var16)->
      super__Vector_base<pbrt::MortonPrimitive,_std::allocator<pbrt::MortonPrimitive>_>)._M_impl.
      super__Vector_impl_data._M_start[iVar14] = *pMVar12;
    }
  }
  local_2f8._M_impl.super__Vector_impl_data._M_end_of_storage = local_2a8;
  local_2f8._M_impl.super__Vector_impl_data._M_start = _orderedPrimsOffset;
  local_2f8._M_impl.super__Vector_impl_data._M_finish = pMStack_2b0;
  _orderedPrimsOffset = pMVar4;
  pMStack_2b0 = pMVar5;
  local_2a8 = pMVar6;
  std::_Vector_base<pbrt::MortonPrimitive,_std::allocator<pbrt::MortonPrimitive>_>::~_Vector_base
            ((_Vector_base<pbrt::MortonPrimitive,_std::allocator<pbrt::MortonPrimitive>_> *)
             &orderedPrimsOffset);
  iVar19 = 0;
  treeletsToBuild.super__Vector_base<pbrt::LBVHTreelet,_std::allocator<pbrt::LBVHTreelet>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  treeletsToBuild.super__Vector_base<pbrt::LBVHTreelet,_std::allocator<pbrt::LBVHTreelet>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  treeletsToBuild.super__Vector_base<pbrt::LBVHTreelet,_std::allocator<pbrt::LBVHTreelet>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  iVar14 = 1;
  for (uVar18 = 1;
      pLVar20 = treeletsToBuild.
                super__Vector_base<pbrt::LBVHTreelet,_std::allocator<pbrt::LBVHTreelet>_>._M_impl.
                super__Vector_impl_data._M_finish,
      pLVar7 = treeletsToBuild.
               super__Vector_base<pbrt::LBVHTreelet,_std::allocator<pbrt::LBVHTreelet>_>._M_impl.
               super__Vector_impl_data._M_start,
      (long)uVar18 <=
      (long)(int)((ulong)((long)local_2f8._M_impl.super__Vector_impl_data._M_finish -
                         (long)local_2f8._M_impl.super__Vector_impl_data._M_start) >> 3);
      uVar18 = uVar18 + 1) {
    if ((uVar18 == ((ulong)((long)local_2f8._M_impl.super__Vector_impl_data._M_finish -
                           (long)local_2f8._M_impl.super__Vector_impl_data._M_start) >> 3 &
                   0xffffffff)) ||
       (((local_2f8._M_impl.super__Vector_impl_data._M_start[uVar18].mortonCode ^
         local_2f8._M_impl.super__Vector_impl_data._M_start[iVar19].mortonCode) & 0x3ffc0000) != 0))
    {
      iVar9 = (*(local_2e0.memoryResource)->_vptr_memory_resource[2])
                        (local_2e0.memoryResource,(long)(iVar14 + iVar19 * -2) * 0x38,8);
      finishedTreelets.
      super__Vector_base<pbrt::BVHBuildNode_*,_std::allocator<pbrt::BVHBuildNode_*>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)CONCAT44(extraout_var,iVar9);
      finishedTreelets.
      super__Vector_base<pbrt::BVHBuildNode_*,_std::allocator<pbrt::BVHBuildNode_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)CONCAT44((int)uVar18 - iVar19,iVar19);
      std::vector<pbrt::LBVHTreelet,_std::allocator<pbrt::LBVHTreelet>_>::
      emplace_back<pbrt::LBVHTreelet>(&treeletsToBuild,(LBVHTreelet *)&finishedTreelets);
      iVar19 = (int)uVar18;
    }
    iVar14 = iVar14 + 2;
  }
  _orderedPrimsOffset = (pointer)((ulong)_orderedPrimsOffset & 0xffffffff00000000);
  local_298._M_unused._M_object = (void *)0x0;
  local_298._8_8_ = 0;
  pcStack_288 = (code *)0x0;
  pcStack_280 = (code *)0x0;
  local_298._M_unused._M_object = operator_new(0x38);
  this_00 = local_2c0;
  *(vector<pbrt::LBVHTreelet,_std::allocator<pbrt::LBVHTreelet>_> **)local_298._M_unused._0_8_ =
       &treeletsToBuild;
  *(BVHAggregate **)((long)local_298._M_unused._0_8_ + 8) = local_2c0;
  *(vector<pbrt::BVHPrimitive,_std::allocator<pbrt::BVHPrimitive>_> **)
   ((long)local_298._M_unused._0_8_ + 0x10) = local_2d0;
  *(_Vector_base<pbrt::MortonPrimitive,_std::allocator<pbrt::MortonPrimitive>_> **)
   ((long)local_298._M_unused._0_8_ + 0x18) = &local_2f8;
  *(vector<pbrt::PrimitiveHandle,_std::allocator<pbrt::PrimitiveHandle>_> **)
   ((long)local_298._M_unused._0_8_ + 0x20) = local_2c8;
  *(atomic<int> **)((long)local_298._M_unused._0_8_ + 0x28) = &orderedPrimsOffset;
  *(atomic<int> ***)((long)local_298._M_unused._0_8_ + 0x30) = &totalNodes_local;
  pcStack_280 = std::
                _Function_handler<void_(long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cpu/aggregates.cpp:437:44)>
                ::_M_invoke;
  pcStack_288 = std::
                _Function_handler<void_(long),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cpu/aggregates.cpp:437:44)>
                ::_M_manager;
  ParallelFor(0,(long)pLVar20 - (long)pLVar7 >> 4,(function<void_(long)> *)&local_298);
  std::_Function_base::~_Function_base((_Function_base *)&local_298);
  finishedTreelets.super__Vector_base<pbrt::BVHBuildNode_*,_std::allocator<pbrt::BVHBuildNode_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  finishedTreelets.super__Vector_base<pbrt::BVHBuildNode_*,_std::allocator<pbrt::BVHBuildNode_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  finishedTreelets.super__Vector_base<pbrt::BVHBuildNode_*,_std::allocator<pbrt::BVHBuildNode_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<pbrt::BVHBuildNode_*,_std::allocator<pbrt::BVHBuildNode_*>_>::reserve
            (&finishedTreelets,
             (long)treeletsToBuild.
                   super__Vector_base<pbrt::LBVHTreelet,_std::allocator<pbrt::LBVHTreelet>_>._M_impl
                   .super__Vector_impl_data._M_finish -
             (long)treeletsToBuild.
                   super__Vector_base<pbrt::LBVHTreelet,_std::allocator<pbrt::LBVHTreelet>_>._M_impl
                   .super__Vector_impl_data._M_start >> 4);
  pLVar7 = treeletsToBuild.super__Vector_base<pbrt::LBVHTreelet,_std::allocator<pbrt::LBVHTreelet>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pLVar20 = treeletsToBuild.
                 super__Vector_base<pbrt::LBVHTreelet,_std::allocator<pbrt::LBVHTreelet>_>._M_impl.
                 super__Vector_impl_data._M_start; pLVar20 != pLVar7; pLVar20 = pLVar20 + 1) {
    std::vector<pbrt::BVHBuildNode_*,_std::allocator<pbrt::BVHBuildNode_*>_>::push_back
              (&finishedTreelets,&pLVar20->buildNodes);
  }
  pBVar10 = buildUpperSAH(this_00,local_2e0,&finishedTreelets,0,
                          (int)((ulong)((long)finishedTreelets.
                                              super__Vector_base<pbrt::BVHBuildNode_*,_std::allocator<pbrt::BVHBuildNode_*>_>
                                              ._M_impl.super__Vector_impl_data._M_finish -
                                       (long)finishedTreelets.
                                             super__Vector_base<pbrt::BVHBuildNode_*,_std::allocator<pbrt::BVHBuildNode_*>_>
                                             ._M_impl.super__Vector_impl_data._M_start) >> 3),
                          totalNodes_local);
  std::_Vector_base<pbrt::BVHBuildNode_*,_std::allocator<pbrt::BVHBuildNode_*>_>::~_Vector_base
            (&finishedTreelets.
              super__Vector_base<pbrt::BVHBuildNode_*,_std::allocator<pbrt::BVHBuildNode_*>_>);
  std::_Vector_base<pbrt::LBVHTreelet,_std::allocator<pbrt::LBVHTreelet>_>::~_Vector_base
            (&treeletsToBuild.
              super__Vector_base<pbrt::LBVHTreelet,_std::allocator<pbrt::LBVHTreelet>_>);
  std::_Vector_base<pbrt::MortonPrimitive,_std::allocator<pbrt::MortonPrimitive>_>::~_Vector_base
            (&local_2f8);
  return pBVar10;
}

Assistant:

BVHBuildNode *BVHAggregate::buildHLBVH(Allocator alloc,
                                       const std::vector<BVHPrimitive> &bvhPrimitives,
                                       std::atomic<int> *totalNodes,
                                       std::vector<PrimitiveHandle> &orderedPrims) {
    // Compute bounding box of all primitive centroids
    Bounds3f bounds;
    for (const BVHPrimitive &pi : bvhPrimitives)
        bounds = Union(bounds, pi.centroid);

    // Compute Morton indices of primitives
    std::vector<MortonPrimitive> mortonPrims(bvhPrimitives.size());
    ParallelFor(0, bvhPrimitives.size(), [&](int64_t i) {
        // Initialize _mortonPrims[i]_ for _i_th primitive
        constexpr int mortonBits = 10;
        constexpr int mortonScale = 1 << mortonBits;
        mortonPrims[i].primitiveIndex = bvhPrimitives[i].primitiveIndex;
        Vector3f centroidOffset = bounds.Offset(bvhPrimitives[i].centroid);
        Vector3f offset = centroidOffset * mortonScale;
        mortonPrims[i].mortonCode = EncodeMorton3(offset.x, offset.y, offset.z);
    });

    // Radix sort primitive Morton indices
    RadixSort(&mortonPrims);

    // Create LBVH treelets at bottom of BVH
    // Find intervals of primitives for each treelet
    std::vector<LBVHTreelet> treeletsToBuild;
    for (int start = 0, end = 1; end <= (int)mortonPrims.size(); ++end) {
        uint32_t mask = 0b00111111111111000000000000000000;
        if (end == (int)mortonPrims.size() || ((mortonPrims[start].mortonCode & mask) !=
                                               (mortonPrims[end].mortonCode & mask))) {
            // Add entry to _treeletsToBuild_ for this treelet
            int nPrimitives = end - start;
            int maxBVHNodes = 2 * nPrimitives - 1;
            BVHBuildNode *nodes = alloc.allocate_object<BVHBuildNode>(maxBVHNodes);
            treeletsToBuild.push_back({start, nPrimitives, nodes});

            start = end;
        }
    }

    // Create LBVHs for treelets in parallel
    std::atomic<int> orderedPrimsOffset(0);
    ParallelFor(0, treeletsToBuild.size(), [&](int i) {
        // Generate _i_th LBVH treelet
        int nodesCreated = 0;
        const int firstBitIndex = 29 - 12;
        LBVHTreelet &tr = treeletsToBuild[i];
        tr.buildNodes = emitLBVH(
            tr.buildNodes, bvhPrimitives, &mortonPrims[tr.startIndex], tr.nPrimitives,
            &nodesCreated, orderedPrims, &orderedPrimsOffset, firstBitIndex);
        *totalNodes += nodesCreated;
    });

    // Create and return SAH BVH from LBVH treelets
    std::vector<BVHBuildNode *> finishedTreelets;
    finishedTreelets.reserve(treeletsToBuild.size());
    for (LBVHTreelet &treelet : treeletsToBuild)
        finishedTreelets.push_back(treelet.buildNodes);
    return buildUpperSAH(alloc, finishedTreelets, 0, finishedTreelets.size(), totalNodes);
}